

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_signature.c
# Opt level: O3

void signature_destroy(signature s)

{
  ulong uVar1;
  set *ppsVar2;
  ulong uVar3;
  
  if (s != (signature)0x0) {
    uVar1 = s->count;
    if (uVar1 != 0) {
      ppsVar2 = &s[1].map;
      uVar3 = 0;
      do {
        if (*ppsVar2 != (set)0x0) {
          free(*ppsVar2);
          uVar1 = s->count;
        }
        uVar3 = uVar3 + 1;
        ppsVar2 = ppsVar2 + 3;
      } while (uVar3 < uVar1);
    }
    set_destroy(s->map);
    free(s);
    return;
  }
  return;
}

Assistant:

void signature_destroy(signature s)
{
	if (s != NULL)
	{
		size_t index;

		for (index = 0; index < s->count; ++index)
		{
			signature_node node = signature_at(s, index);

			if (node != NULL && node->name != NULL)
			{
				free(node->name);
			}
		}

		set_destroy(s->map);

		free(s);
	}
}